

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractmodelserialiser.cpp
# Opt level: O0

void __thiscall
AbstractModelSerialiser::AbstractModelSerialiser(AbstractModelSerialiser *this,QObject *parent)

{
  AbstractModelSerialiserPrivate *this_00;
  QObject *parent_local;
  AbstractModelSerialiser *this_local;
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_001d2650;
  this_00 = (AbstractModelSerialiserPrivate *)operator_new(0x38);
  AbstractModelSerialiserPrivate::AbstractModelSerialiserPrivate(this_00,this);
  QScopedPointer<AbstractModelSerialiserPrivate,_QScopedPointerDeleter<AbstractModelSerialiserPrivate>_>
  ::QScopedPointer(&this->d_ptr,this_00);
  return;
}

Assistant:

AbstractModelSerialiser::AbstractModelSerialiser(QObject *parent)
    : QObject(parent)
    , d_ptr(new AbstractModelSerialiserPrivate(this))
{ }